

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_conv_transpose_1d(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,int s0,int p0,int d0)

{
  ggml_tensor *tensor;
  char *pcVar1;
  int line;
  int32_t params [3];
  int64_t ne [4];
  
  if ((b->ne[2] == 1) && (b->ne[3] == 1)) {
    if (a->ne[2] == b->ne[1]) {
      if (a->ne[3] == 1) {
        if (p0 == 0) {
          if (d0 == 1) {
            ne[0] = (b->ne[0] + -1) * (long)s0 + a->ne[0];
            ne[1] = a->ne[1];
            ne[2] = 1;
            ne[3] = 1;
            tensor = ggml_new_tensor(ctx,GGML_TYPE_F32,4,ne);
            params[1] = 0;
            params[2] = 1;
            params[0] = s0;
            ggml_set_op_params(tensor,params,0xc);
            tensor->op = GGML_OP_CONV_TRANSPOSE_1D;
            tensor->src[0] = a;
            tensor->src[1] = b;
            return tensor;
          }
          pcVar1 = "d0 == 1";
          line = 0xf84;
        }
        else {
          pcVar1 = "p0 == 0";
          line = 0xf83;
        }
      }
      else {
        pcVar1 = "a->ne[3] == 1";
        line = 0xf81;
      }
    }
    else {
      pcVar1 = "a->ne[2] == b->ne[1]";
      line = 0xf80;
    }
  }
  else {
    pcVar1 = "ggml_is_matrix(b)";
    line = 0xf7f;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",line,
             "GGML_ASSERT(%s) failed",pcVar1);
}

Assistant:

ggml_tensor * ggml_conv_transpose_1d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        int                   s0,
        int                   p0,
        int                   d0) {
    GGML_ASSERT(ggml_is_matrix(b));
    GGML_ASSERT(a->ne[2] == b->ne[1]);
    GGML_ASSERT(a->ne[3] == 1);

    GGML_ASSERT(p0 == 0);
    GGML_ASSERT(d0 == 1);

    const int64_t ne[4] = {
        ggml_calc_conv_transpose_1d_output_size(b->ne[0], a->ne[0], s0, 0 /*p0*/, 1 /*d0*/),
        a->ne[1], b->ne[2], 1,
    };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    int32_t params[] = { s0, p0, d0 };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_CONV_TRANSPOSE_1D;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}